

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV extractObjectInformation
                (CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_CLASS *objClass,
                CK_KEY_TYPE *keyType,CK_CERTIFICATE_TYPE *certType,CK_BBOOL *isOnToken,
                CK_BBOOL *isPrivate,bool bImplicit)

{
  CK_ATTRIBUTE_TYPE CVar1;
  byte bVar2;
  bool bVar3;
  CK_RV CVar4;
  bool bVar5;
  unsigned_long *puVar6;
  byte bVar7;
  bool bVar8;
  
  if (ulCount == 0) {
    bVar8 = true;
    bVar2 = 0;
    bVar5 = false;
    bVar3 = false;
  }
  else {
    puVar6 = &pTemplate->ulValueLen;
    bVar3 = false;
    bVar5 = false;
    bVar2 = 0;
    bVar7 = 0;
    do {
      CVar1 = ((_CK_ATTRIBUTE *)(puVar6 + -2))->type;
      if ((long)CVar1 < 2) {
        if (CVar1 == 0) {
          if (*puVar6 == 8) {
            *objClass = *(CK_OBJECT_CLASS *)puVar6[-1];
            bVar7 = 1;
          }
        }
        else if ((CVar1 == 1) && (*puVar6 == 1)) {
          *isOnToken = *(CK_BBOOL *)puVar6[-1];
        }
      }
      else if (CVar1 == 2) {
        if (*puVar6 == 1) {
          *isPrivate = *(CK_BBOOL *)puVar6[-1];
          bVar3 = true;
        }
      }
      else if (CVar1 == 0x80) {
        if (*puVar6 == 8) {
          *certType = *(CK_CERTIFICATE_TYPE *)puVar6[-1];
          bVar5 = true;
        }
      }
      else if ((CVar1 == 0x100) && (*puVar6 == 8)) {
        *keyType = *(CK_KEY_TYPE *)puVar6[-1];
        bVar2 = 1;
      }
      puVar6 = puVar6 + 3;
      ulCount = ulCount - 1;
    } while (ulCount != 0);
    bVar8 = (bool)(bVar7 ^ 1);
  }
  CVar4 = 0;
  if (!bImplicit) {
    CVar4 = 0xd0;
  }
  if (!bVar8 && !bImplicit) {
    if ((bool)(*objClass - 5 < 0xfffffffffffffffd | bVar2)) {
      if (*objClass == 1) {
        if (!bVar5) {
          return 0xd0;
        }
        if (!bVar3) {
          *isPrivate = '\0';
        }
      }
      if (*objClass == 2 && !bVar3) {
        *isPrivate = '\0';
      }
      CVar4 = 0;
    }
    else {
      CVar4 = 0xd0;
    }
  }
  return CVar4;
}

Assistant:

static CK_RV extractObjectInformation(CK_ATTRIBUTE_PTR pTemplate,
				      CK_ULONG ulCount,
				      CK_OBJECT_CLASS &objClass,
				      CK_KEY_TYPE &keyType,
				      CK_CERTIFICATE_TYPE &certType,
				      CK_BBOOL &isOnToken,
				      CK_BBOOL &isPrivate,
				      bool bImplicit)
{
	bool bHasClass = false;
	bool bHasKeyType = false;
	bool bHasCertType = false;
	bool bHasPrivate = false;

	// Extract object information
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
				if (pTemplate[i].ulValueLen == sizeof(CK_OBJECT_CLASS))
				{
					objClass = *(CK_OBJECT_CLASS_PTR)pTemplate[i].pValue;
					bHasClass = true;
				}
				break;
			case CKA_KEY_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_KEY_TYPE))
				{
					keyType = *(CK_KEY_TYPE*)pTemplate[i].pValue;
					bHasKeyType = true;
				}
				break;
			case CKA_CERTIFICATE_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_CERTIFICATE_TYPE))
				{
					certType = *(CK_CERTIFICATE_TYPE*)pTemplate[i].pValue;
					bHasCertType = true;
				}
				break;
			case CKA_TOKEN:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
				}
				break;
			case CKA_PRIVATE:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
					bHasPrivate = true;
				}
				break;
			default:
				break;
		}
	}

	if (bImplicit)
	{
		return CKR_OK;
	}

	if (!bHasClass)
	{
		return CKR_TEMPLATE_INCOMPLETE;
	}

	bool bKeyTypeRequired = (objClass == CKO_PUBLIC_KEY || objClass == CKO_PRIVATE_KEY || objClass == CKO_SECRET_KEY);
	if (bKeyTypeRequired && !bHasKeyType)
	{
		 return CKR_TEMPLATE_INCOMPLETE;
	}

	if (objClass == CKO_CERTIFICATE)
	{
		if (!bHasCertType)
		{
			return CKR_TEMPLATE_INCOMPLETE;
		}
		if (!bHasPrivate)
		{
			// Change default value for certificates
			isPrivate = CK_FALSE;
		}
	}

	if (objClass == CKO_PUBLIC_KEY && !bHasPrivate)
	{
		// Change default value for public keys
		isPrivate = CK_FALSE;
	}

	return CKR_OK;
}